

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall QL_Manager::GetAttrCatEntry(QL_Manager *this,RelAttr attr,AttrCatEntry **entry)

{
  uint in_EAX;
  RC RVar1;
  int index;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  RVar1 = GetAttrCatEntryPos(this,attr,(int *)((long)&uStack_18 + 4));
  if (RVar1 == 0) {
    *entry = this->attrEntries + uStack_18._4_4_;
  }
  return RVar1;
}

Assistant:

RC QL_Manager::GetAttrCatEntry(const RelAttr attr, AttrCatEntry *&entry){
  RC rc = 0;
  int index = 0;
  if((rc = GetAttrCatEntryPos(attr, index)))
    return (rc);
  entry = attrEntries + index;
  return (0);
}